

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_dey_clears_n_flag_Test::~CpuTest_dey_clears_n_flag_Test
          (CpuTest_dey_clears_n_flag_Test *this)

{
  CpuTest_dey_clears_n_flag_Test *this_local;
  
  ~CpuTest_dey_clears_n_flag_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, dey_clears_n_flag) {
    stage_instruction(DEY);
    registers.y = 128;
    registers.p |= N_FLAG;
    expected.y = 127;
    expected.p = 0;

    step_execution(2);
    EXPECT_EQ(expected, registers);
}